

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O2

int Abc_ZddUniqueCreate(Abc_ZddMan *p,int Var,int True,int False)

{
  Abc_ZddObj *pAVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int *piVar5;
  
  if ((Var < 0) || (p->nVars <= Var)) {
    __assert_fail("Var >= 0 && Var < p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPerm.c"
                  ,0x8f,"int Abc_ZddUniqueCreate(Abc_ZddMan *, int, int, int)");
  }
  pAVar1 = p->pObjs;
  if ((*(uint *)(pAVar1 + True) & 0x7fffffff) <= (uint)Var) {
    __assert_fail("Var < Abc_ZddObjVar(p, True)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPerm.c"
                  ,0x90,"int Abc_ZddUniqueCreate(Abc_ZddMan *, int, int, int)");
  }
  if ((*(uint *)(pAVar1 + False) & 0x7fffffff) <= (uint)Var) {
    __assert_fail("Var < Abc_ZddObjVar(p, False)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPerm.c"
                  ,0x91,"int Abc_ZddUniqueCreate(Abc_ZddMan *, int, int, int)");
  }
  if (True != 0) {
    piVar5 = p->pUnique + (False * 0xb5051 + True * 0x40f1f9 + Var * 0xc00005 & p->nUniqueMask);
    while( true ) {
      lVar3 = (long)*piVar5;
      if (lVar3 == 0) break;
      if ((((*(uint *)(pAVar1 + lVar3) & 0x7fffffff) == Var) && (pAVar1[lVar3].True == True)) &&
         (pAVar1[lVar3].False == False)) {
        return *piVar5;
      }
      piVar5 = p->pNexts + lVar3;
    }
    iVar4 = p->nObjs;
    iVar2 = p->nObjsAlloc;
    if (iVar4 == iVar2) {
      printf("Aborting because the number of nodes exceeded %d.\n");
      fflush(_stdout);
      iVar4 = p->nObjs;
      iVar2 = p->nObjsAlloc;
    }
    if (iVar2 <= iVar4) {
      __assert_fail("p->nObjs < p->nObjsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPerm.c"
                    ,0x9b,"int Abc_ZddUniqueCreate(Abc_ZddMan *, int, int, int)");
    }
    p->nObjs = iVar4 + 1;
    *piVar5 = iVar4;
    *(uint *)(p->pObjs + iVar4) = *(uint *)(p->pObjs + iVar4) & 0x80000000 | Var;
    pAVar1 = p->pObjs;
    pAVar1[*piVar5].True = True;
    pAVar1[*piVar5].False = False;
    False = *piVar5;
  }
  return False;
}

Assistant:

static inline int Abc_ZddUniqueCreate( Abc_ZddMan * p, int Var, int True, int False )
{
    assert( Var >= 0 && Var < p->nVars );
    assert( Var < Abc_ZddObjVar(p, True) );
    assert( Var < Abc_ZddObjVar(p, False) );
    if ( True == 0 )
        return False;
    {
        int *q = p->pUnique + (Abc_ZddHash(Var, True, False) & p->nUniqueMask);
        for ( ; *q; q = p->pNexts + *q )
            if ( p->pObjs[*q].Var == (unsigned)Var && p->pObjs[*q].True == (unsigned)True && p->pObjs[*q].False == (unsigned)False )
                return *q;
        if ( p->nObjs == p->nObjsAlloc )
            printf( "Aborting because the number of nodes exceeded %d.\n", p->nObjsAlloc ), fflush(stdout);
        assert( p->nObjs < p->nObjsAlloc );     
        *q = p->nObjs++;
        p->pObjs[*q].Var = Var;
        p->pObjs[*q].True = True;
        p->pObjs[*q].False = False;
//        printf( "Added node %3d: Var = %3d.  True = %3d.  False = %3d\n", *q, Var, True, False );
        return *q;
    }
}